

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCCommon.h
# Opt level: O1

void SL::Screen_Capture::
     ProcessCapture<SL::Screen_Capture::CaptureData<std::function<void(SL::Screen_Capture::Image_const&,SL::Screen_Capture::Monitor_const&)>,std::function<void(SL::Screen_Capture::Image_const*,SL::Screen_Capture::MousePoint_const&)>,std::function<std::vector<SL::Screen_Capture::Monitor,std::allocator<SL::Screen_Capture::Monitor>>()>>,SL::Screen_Capture::Monitor>
               (CaptureData<std::function<void_(const_SL::Screen_Capture::Image_&,_const_SL::Screen_Capture::Monitor_&)>,_std::function<void_(const_SL::Screen_Capture::Image_*,_const_SL::Screen_Capture::MousePoint_&)>,_std::function<std::vector<SL::Screen_Capture::Monitor,_std::allocator<SL::Screen_Capture::Monitor>_>_()>_>
                *data,BaseFrameProcessor *base,Monitor *mointor,uchar *startsrc,int srcrowstride)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  pointer imgrect;
  long lVar4;
  BaseFrameProcessor *pBVar5;
  uchar *__dest;
  vector<SL::Screen_Capture::ImageRect,_std::allocator<SL::Screen_Capture::ImageRect>_> imgdifs;
  Image wholeimg;
  Image difimg;
  Image oldimg;
  ImageRect local_d8;
  BaseFrameProcessor *local_c0;
  Monitor *local_b8;
  _Any_data *local_b0;
  vector<SL::Screen_Capture::ImageRect,_std::allocator<SL::Screen_Capture::ImageRect>_> local_a8;
  Image local_90;
  Image local_70;
  Image local_50;
  
  local_d8.left = 0;
  local_d8.top = 0;
  local_d8.right = 0;
  local_d8.bottom = 0;
  iVar1 = Height(mointor);
  local_d8.bottom = iVar1;
  local_d8.right = Width(mointor);
  iVar1 = Width(mointor);
  iVar1 = iVar1 * 4;
  local_c0 = base;
  if ((data->OnNewFrame).super__Function_base._M_manager != (_Manager_type)0x0) {
    CreateImage(&local_90,&local_d8,srcrowstride,(ImageBGRA *)startsrc);
    local_90.isContiguous = iVar1 == srcrowstride;
    if ((data->OnNewFrame).super__Function_base._M_manager == (_Manager_type)0x0) goto LAB_0011110f;
    (*(data->OnNewFrame)._M_invoker)((_Any_data *)&data->OnNewFrame,&local_90,mointor);
  }
  pBVar5 = local_c0;
  if ((data->OnFrameChanged).super__Function_base._M_manager != (_Manager_type)0x0) {
    local_b0 = (_Any_data *)&data->OnFrameChanged;
    if (local_c0->FirstRun == true) {
      CreateImage(&local_90,&local_d8,srcrowstride,(ImageBGRA *)startsrc);
      local_90.isContiguous = iVar1 == srcrowstride;
      if ((data->OnFrameChanged).super__Function_base._M_manager == (_Manager_type)0x0) {
LAB_0011110f:
        uVar3 = std::__throw_bad_function_call();
        if (local_a8.
            super__Vector_base<SL::Screen_Capture::ImageRect,_std::allocator<SL::Screen_Capture::ImageRect>_>
            ._M_impl.super__Vector_impl_data._M_start != (ImageRect *)0x0) {
          operator_delete(local_a8.
                          super__Vector_base<SL::Screen_Capture::ImageRect,_std::allocator<SL::Screen_Capture::ImageRect>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_a8.
                                super__Vector_base<SL::Screen_Capture::ImageRect,_std::allocator<SL::Screen_Capture::ImageRect>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_a8.
                                super__Vector_base<SL::Screen_Capture::ImageRect,_std::allocator<SL::Screen_Capture::ImageRect>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        _Unwind_Resume(uVar3);
      }
      (*(data->OnFrameChanged)._M_invoker)(local_b0,&local_90,mointor);
      pBVar5->FirstRun = false;
    }
    else {
      local_b8 = mointor;
      CreateImage(&local_90,&local_d8,srcrowstride,(ImageBGRA *)startsrc);
      CreateImage(&local_50,&local_d8,0,
                  (ImageBGRA *)
                  (pBVar5->ImageBuffer)._M_t.
                  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
      GetDifs(&local_a8,&local_50,&local_90);
      if (local_a8.
          super__Vector_base<SL::Screen_Capture::ImageRect,_std::allocator<SL::Screen_Capture::ImageRect>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_a8.
          super__Vector_base<SL::Screen_Capture::ImageRect,_std::allocator<SL::Screen_Capture::ImageRect>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        imgrect = local_a8.
                  super__Vector_base<SL::Screen_Capture::ImageRect,_std::allocator<SL::Screen_Capture::ImageRect>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          CreateImage(&local_70,imgrect,srcrowstride,
                      (ImageBGRA *)
                      (startsrc + (long)imgrect->top * (long)srcrowstride + (long)imgrect->left * 4)
                     );
          local_70.isContiguous = false;
          if ((data->OnFrameChanged).super__Function_base._M_manager == (_Manager_type)0x0) {
            std::__throw_bad_function_call();
            goto LAB_0011110f;
          }
          (*(data->OnFrameChanged)._M_invoker)(local_b0,&local_70,local_b8);
          imgrect = imgrect + 1;
        } while (imgrect !=
                 local_a8.
                 super__Vector_base<SL::Screen_Capture::ImageRect,_std::allocator<SL::Screen_Capture::ImageRect>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      mointor = local_b8;
      pBVar5 = local_c0;
      if (local_a8.
          super__Vector_base<SL::Screen_Capture::ImageRect,_std::allocator<SL::Screen_Capture::ImageRect>_>
          ._M_impl.super__Vector_impl_data._M_start != (ImageRect *)0x0) {
        operator_delete(local_a8.
                        super__Vector_base<SL::Screen_Capture::ImageRect,_std::allocator<SL::Screen_Capture::ImageRect>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_a8.
                              super__Vector_base<SL::Screen_Capture::ImageRect,_std::allocator<SL::Screen_Capture::ImageRect>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a8.
                              super__Vector_base<SL::Screen_Capture::ImageRect,_std::allocator<SL::Screen_Capture::ImageRect>_>
                              ._M_impl.super__Vector_impl_data._M_start);
        pBVar5 = local_c0;
      }
    }
    __dest = (pBVar5->ImageBuffer)._M_t.
             super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
             super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    iVar2 = Height(mointor);
    if (iVar1 == srcrowstride) {
      memcpy(__dest,startsrc,(long)(iVar2 * iVar1));
    }
    else if (0 < iVar2) {
      lVar4 = 0;
      do {
        memcpy(__dest,startsrc,(long)iVar1);
        lVar4 = lVar4 + 1;
        iVar2 = Height(mointor);
        startsrc = startsrc + srcrowstride;
        __dest = __dest + iVar1;
      } while (lVar4 < iVar2);
    }
  }
  return;
}

Assistant:

void ProcessCapture(const F &data, BaseFrameProcessor &base, const C &mointor, const unsigned char *startsrc, int srcrowstride)
    {
        ImageRect imageract;
        imageract.left = 0;
        imageract.top = 0;
        imageract.bottom = Height(mointor);
        imageract.right = Width(mointor);
        const auto sizeofimgbgra = static_cast<int>(sizeof(ImageBGRA));
        const auto startimgsrc = reinterpret_cast<const ImageBGRA *>(startsrc);
        auto dstrowstride = sizeofimgbgra * Width(mointor);
        if (data.OnNewFrame) { // each frame we still let the caller know if asked for
            auto wholeimg = CreateImage(imageract, srcrowstride, startimgsrc);
            wholeimg.isContiguous = dstrowstride == srcrowstride;
            data.OnNewFrame(wholeimg, mointor);
        }
        if (data.OnFrameChanged) { // difs are needed, which means that we must hold the last known image in memory for comparisons...
            if (base.FirstRun) {
                // first time through, just send the whole image
                auto wholeimg = CreateImage(imageract, srcrowstride, startimgsrc);
                wholeimg.isContiguous = dstrowstride == srcrowstride;
                data.OnFrameChanged(wholeimg, mointor);
                base.FirstRun = false;
            }
            else {
                // user wants difs, lets do it!
                auto newimg = CreateImage(imageract, srcrowstride, startimgsrc);
                auto oldimg = CreateImage(imageract, 0, reinterpret_cast<const ImageBGRA *>(base.ImageBuffer.get()));
                auto imgdifs = GetDifs(oldimg, newimg);

                for (auto &r : imgdifs) {
                    auto leftoffset = r.left * sizeofimgbgra;
                    auto thisstartsrc = startsrc + leftoffset + (r.top * srcrowstride);

                    auto difimg = CreateImage(r, srcrowstride, reinterpret_cast<const ImageBGRA *>(thisstartsrc));
                    difimg.isContiguous = false;
                    data.OnFrameChanged(difimg, mointor);
                }
            }
            auto startdst = base.ImageBuffer.get(); 
            assert(base.ImageBufferSize >= dstrowstride * Height(mointor));
            if (dstrowstride == srcrowstride) { // no need for multiple calls, there is no padding here 
                memcpy(startdst, startsrc, dstrowstride * Height(mointor));
            }
            else { 
                for (auto i = 0; i < Height(mointor); i++) {
                    memcpy(startdst + (i * dstrowstride), startsrc + (i * srcrowstride), dstrowstride);
                }
            }
        }
    }